

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

wchar_t lzx_read_bitlen(lzx_stream *strm,huffman *d,wchar_t end)

{
  lzx_br *br;
  ushort uVar1;
  lzx_dec *plVar2;
  ulong uVar3;
  uchar *puVar4;
  htree_t *phVar5;
  wchar_t wVar6;
  long lVar7;
  wchar_t wVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  wchar_t wVar12;
  htree_t *phVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  wchar_t wVar17;
  bool bVar18;
  
  plVar2 = strm->ds;
  wVar16 = plVar2->loop;
  if (wVar16 == L'\0') {
    d->freq[0xc] = L'\0';
    d->freq[0xd] = L'\0';
    d->freq[0xe] = L'\0';
    d->freq[0xf] = L'\0';
    d->freq[8] = L'\0';
    d->freq[9] = L'\0';
    d->freq[10] = L'\0';
    d->freq[0xb] = L'\0';
    d->freq[4] = L'\0';
    d->freq[5] = L'\0';
    d->freq[6] = L'\0';
    d->freq[7] = L'\0';
    d->freq[0] = L'\0';
    d->freq[1] = L'\0';
    d->freq[2] = L'\0';
    d->freq[3] = L'\0';
    d->freq[0x10] = L'\0';
  }
  if (end < L'\0') {
    end = d->len_size;
  }
  wVar6 = L'\x01';
  if (wVar16 < end) {
    br = &plVar2->br;
    do {
      plVar2->loop = wVar16;
      if ((((plVar2->br).cache_avail < (plVar2->pt).max_bits) &&
          (wVar6 = lzx_br_fillup(strm,br), wVar6 == L'\0')) &&
         ((plVar2->br).cache_avail < (plVar2->pt).max_bits)) {
LAB_004500b5:
        wVar6 = L'\0';
        goto LAB_004500b7;
      }
      wVar6 = (plVar2->br).cache_avail;
      wVar17 = (plVar2->pt).max_bits;
      uVar11 = (uint)((plVar2->br).cache_buffer >> ((char)wVar6 - (char)wVar17 & 0x3fU)) &
               cache_masks[wVar17];
      wVar8 = (plVar2->pt).shift_bits;
      uVar1 = (plVar2->pt).tbl[uVar11 >> ((byte)wVar8 & 0x1f)];
      wVar14 = (wchar_t)uVar1;
      wVar15 = (plVar2->pt).len_size;
      wVar12 = wVar14;
      if (wVar15 <= (int)(uint)uVar1) {
        phVar5 = (plVar2->pt).tree;
        do {
          wVar12 = L'\0';
          if ((wVar8 < L'\x01') || (wVar14 = wVar14 - wVar15, (plVar2->pt).tree_used <= wVar14))
          break;
          wVar8 = wVar8 + L'\xffffffff';
          phVar13 = (htree_t *)&phVar5[wVar14].right;
          if ((uVar11 >> (wVar8 & 0x1fU) & 1) != 0) {
            phVar13 = phVar5 + wVar14;
          }
          wVar14 = (wchar_t)phVar13->left;
          wVar12 = wVar14;
        } while (wVar15 <= wVar14);
      }
      if (wVar12 == L'\x13') {
        if (((wVar6 < (uint)(plVar2->pt).bitlen[0x13] + wVar17 + L'\x01') &&
            (wVar6 = lzx_br_fillup(strm,br), wVar6 == L'\0')) &&
           ((plVar2->br).cache_avail <
            (uint)(plVar2->pt).bitlen[0x13] + (plVar2->pt).max_bits + L'\x01')) goto LAB_004500b5;
        puVar4 = (plVar2->pt).bitlen;
        wVar6 = (plVar2->br).cache_avail - (uint)puVar4[0x13];
        (plVar2->br).cache_avail = wVar6;
        uVar3 = (plVar2->br).cache_buffer;
        wVar6 = wVar6 + L'\xffffffff';
        bVar18 = (uVar3 >> ((ulong)(uint)wVar6 & 0x3f) & 1) != 0;
        if (end < (uint)bVar18 + wVar16 + L'\x04') {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar6;
        wVar17 = (plVar2->pt).max_bits;
        uVar11 = (uint)(uVar3 >> ((char)wVar6 - (char)wVar17 & 0x3fU)) & cache_masks[wVar17];
        wVar17 = (plVar2->pt).shift_bits;
        wVar8 = (plVar2->pt).len_size;
        uVar1 = (plVar2->pt).tbl[uVar11 >> ((byte)wVar17 & 0x1f)];
        wVar15 = (wchar_t)uVar1;
        if ((int)(uint)uVar1 < wVar8) {
          wVar12 = (uint)uVar1;
        }
        else {
          phVar5 = (plVar2->pt).tree;
          do {
            wVar12 = L'\0';
            if ((wVar17 < L'\x01') || (wVar15 = wVar15 - wVar8, (plVar2->pt).tree_used <= wVar15))
            break;
            wVar17 = wVar17 + L'\xffffffff';
            phVar13 = (htree_t *)&phVar5[wVar15].right;
            if ((uVar11 >> (wVar17 & 0x1fU) & 1) != 0) {
              phVar13 = phVar5 + wVar15;
            }
            wVar15 = (wchar_t)phVar13->left;
            wVar12 = wVar15;
          } while (wVar8 <= wVar15);
        }
        (plVar2->br).cache_avail = wVar6 - (uint)puVar4[(uint)wVar12];
        lVar7 = (long)wVar16;
        uVar11 = (((uint)d->bitlen[lVar7] - wVar12) + 0x11) % 0x11;
        if ((int)uVar11 < 0) {
          return L'\xffffffff';
        }
        uVar10 = (uint)bVar18;
        iVar9 = 0;
        do {
          d->bitlen[lVar7] = (uchar)uVar11;
          lVar7 = lVar7 + 1;
          iVar9 = iVar9 + -1;
        } while (-4 - uVar10 != iVar9);
        wVar16 = wVar16 - iVar9;
        d->freq[uVar11] = d->freq[uVar11] + (uVar10 | 4);
      }
      else if (wVar12 == L'\x12') {
        if (((wVar6 < (uint)(plVar2->pt).bitlen[0x12] + L'\x05') &&
            (wVar6 = lzx_br_fillup(strm,br), wVar6 == L'\0')) &&
           ((plVar2->br).cache_avail < (uint)(plVar2->pt).bitlen[0x12] + L'\x05'))
        goto LAB_004500b5;
        wVar6 = (plVar2->br).cache_avail - (uint)(plVar2->pt).bitlen[0x12];
        (plVar2->br).cache_avail = wVar6;
        wVar6 = wVar6 + L'\xfffffffb';
        uVar11 = (uint)((plVar2->br).cache_buffer >> ((byte)wVar6 & 0x3f)) & 0x1f;
        wVar17 = uVar11 + wVar16 + L'\x14';
        if (end < wVar17) {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar6;
        memset(d->bitlen + wVar16,0,(ulong)(uVar11 + 0x14));
        wVar16 = wVar17;
      }
      else if (wVar12 == L'\x11') {
        if (((wVar6 < (uint)(plVar2->pt).bitlen[0x11] + L'\x04') &&
            (wVar6 = lzx_br_fillup(strm,br), wVar6 == L'\0')) &&
           ((plVar2->br).cache_avail < (uint)(plVar2->pt).bitlen[0x11] + L'\x04'))
        goto LAB_004500b5;
        wVar6 = (plVar2->br).cache_avail - (uint)(plVar2->pt).bitlen[0x11];
        (plVar2->br).cache_avail = wVar6;
        wVar6 = wVar6 + L'\xfffffffc';
        uVar11 = (uint)((plVar2->br).cache_buffer >> ((byte)wVar6 & 0x3f)) & 0xf;
        if (end < uVar11 + wVar16 + L'\x04') {
          return L'\xffffffff';
        }
        (plVar2->br).cache_avail = wVar6;
        lVar7 = (long)wVar16;
        iVar9 = 0;
        do {
          d->bitlen[lVar7] = '\0';
          lVar7 = lVar7 + 1;
          iVar9 = iVar9 + -1;
        } while (-4 - uVar11 != iVar9);
        wVar16 = wVar16 - iVar9;
      }
      else {
        (plVar2->br).cache_avail = wVar6 - (uint)(plVar2->pt).bitlen[(uint)wVar12];
        puVar4 = d->bitlen;
        uVar11 = (((uint)puVar4[wVar16] - wVar12) + 0x11) % 0x11;
        if ((int)uVar11 < 0) {
          return L'\xffffffff';
        }
        d->freq[uVar11] = d->freq[uVar11] + L'\x01';
        puVar4[wVar16] = (uchar)uVar11;
        wVar16 = wVar16 + L'\x01';
      }
    } while (wVar16 < end);
    wVar6 = L'\x01';
  }
LAB_004500b7:
  plVar2->loop = wVar16;
  return wVar6;
}

Assistant:

static int
lzx_read_bitlen(struct lzx_stream *strm, struct huffman *d, int end)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int c, i, j, ret, same;
	unsigned rbits;

	i = ds->loop;
	if (i == 0)
		memset(d->freq, 0, sizeof(d->freq));
	ret = 0;
	if (end < 0)
		end = d->len_size;
	while (i < end) {
		ds->loop = i;
		if (!lzx_br_read_ahead(strm, br, ds->pt.max_bits))
			goto getdata;
		rbits = lzx_br_bits(br, ds->pt.max_bits);
		c = lzx_decode_huffman(&(ds->pt), rbits);
		switch (c) {
		case 17:/* several zero lengths, from 4 to 19. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+4))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 4) + 4;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 4);
			for (j = 0; j < same; j++)
				d->bitlen[i++] = 0;
			break;
		case 18:/* many zero lengths, from 20 to 51. */
			if (!lzx_br_read_ahead(strm, br, ds->pt.bitlen[c]+5))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 5) + 20;
			if (i + same > end)
				return (-1);/* Invalid */
			lzx_br_consume(br, 5);
			memset(d->bitlen + i, 0, same);
			i += same;
			break;
		case 19:/* a few same lengths. */
			if (!lzx_br_read_ahead(strm, br,
			    ds->pt.bitlen[c]+1+ds->pt.max_bits))
				goto getdata;
			lzx_br_consume(br, ds->pt.bitlen[c]);
			same = lzx_br_bits(br, 1) + 4;
			if (i + same > end)
				return (-1);
			lzx_br_consume(br, 1);
			rbits = lzx_br_bits(br, ds->pt.max_bits);
			c = lzx_decode_huffman(&(ds->pt), rbits);
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			for (j = 0; j < same; j++)
				d->bitlen[i++] = c;
			d->freq[c] += same;
			break;
		default:
			lzx_br_consume(br, ds->pt.bitlen[c]);
			c = (d->bitlen[i] - c + 17) % 17;
			if (c < 0)
				return (-1);/* Invalid */
			d->freq[c]++;
			d->bitlen[i++] = c;
			break;
		}
	}
	ret = 1;
getdata:
	ds->loop = i;
	return (ret);
}